

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OStream.h
# Opt level: O2

ostream * Gs::operator<<(ostream *stream,Matrix<float,_10UL,_10UL> *mat)

{
  char cVar1;
  byte bVar2;
  size_t sVar3;
  size_t sVar4;
  ostream *poVar5;
  long lVar6;
  float *pfVar7;
  ulong uVar8;
  size_t c;
  long lVar9;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  size_t lengths [10];
  
  lVar9 = 0;
  pfVar7 = mat->m_;
  for (; lVar9 != 10; lVar9 = lVar9 + 1) {
    lengths[lVar9] = 0;
    uVar8 = 0;
    for (lVar6 = 0; lVar6 != 0x28; lVar6 = lVar6 + 4) {
      sVar3 = Details::Length<float>((float *)((long)pfVar7 + lVar6));
      if (uVar8 <= sVar3) {
        uVar8 = sVar3;
      }
      lengths[lVar9] = uVar8;
    }
    pfVar7 = pfVar7 + 10;
  }
  for (lVar9 = 0; lVar9 != 10; lVar9 = lVar9 + 1) {
    bVar2 = (lVar9 != 9) << 5 | 0x5c;
    if (lVar9 == 0) {
      bVar2 = 0x2f;
    }
    std::operator<<(stream,bVar2);
    lVar6 = 0;
    pfVar7 = mat->m_;
    for (; lVar6 != 10; lVar6 = lVar6 + 1) {
      sVar3 = lengths[lVar6];
      sVar4 = Details::Length<float>(pfVar7);
      local_a8[0] = local_98;
      std::__cxx11::string::_M_construct((ulong)local_a8,((char)sVar3 - (char)sVar4) + '\x01');
      std::operator<<(stream,(string *)local_a8);
      std::__cxx11::string::~string((string *)local_a8);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)stream,*pfVar7);
      std::operator<<(poVar5,' ');
      pfVar7 = pfVar7 + 10;
    }
    cVar1 = '|';
    if (lVar9 == 9) {
      cVar1 = '/';
    }
    if (lVar9 == 0) {
      cVar1 = '\\';
    }
    poVar5 = std::operator<<(stream,cVar1);
    std::endl<char,std::char_traits<char>>(poVar5);
    mat = (Matrix<float,_10UL,_10UL> *)((long)mat + 4);
  }
  return stream;
}

Assistant:

std::ostream& operator << (std::ostream& stream, const Matrix<T, Rows, Cols>& mat)
{
    /* Determine longest elements for each row */
    std::size_t lengths[Matrix<T, Rows, Cols>::columns];

    for (std::size_t c = 0; c < Matrix<T, Rows, Cols>::columns; ++c)
    {
        lengths[c] = 0;
        for (std::size_t r = 0; r < Matrix<T, Rows, Cols>::rows; ++r)
            lengths[c] = std::max<std::size_t>(lengths[c], Details::Length(mat(r, c)));
    }

    /* Write each row */
    for (std::size_t r = 0; r < Rows; ++r)
    {
        stream << (r == 0 ? '/' : r + 1 == Rows ? '\\' : '|');

        for (std::size_t c = 0; c < Cols; ++c)
        {
            stream << std::string(lengths[c] + 1u - Details::Length(mat(r, c)), ' ');
            stream << mat(r, c) << ' ';
        }

        stream << (r == 0 ? '\\' : r + 1 == Rows ? '/' : '|')  << std::endl;
    }

    return stream;
}